

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O0

obj * touchfood(obj *otmp)

{
  ushort uVar1;
  boolean bVar2;
  int iVar3;
  uint local_14;
  obj *local_10;
  obj *otmp_local;
  
  local_10 = otmp;
  if (1 < otmp->quan) {
    if (otmp->where == '\x03') {
      local_10 = splitobj(otmp,1);
    }
    else {
      splitobj(otmp,(long)otmp->quan + -1);
    }
  }
  if (local_10->oeaten == 0) {
    if ((((local_10->where != '\x03') &&
         (bVar2 = costly_spot(local_10->ox,local_10->oy), bVar2 != '\0')) &&
        ((*(uint *)&local_10->field_0x4a >> 3 & 1) == 0)) ||
       ((*(uint *)&local_10->field_0x4a >> 2 & 1) != 0)) {
      verbalize("You bit it, you bought it!");
      bill_dummy_object(local_10);
    }
    if (local_10->otyp == 0x10e) {
      uVar1 = mons[local_10->corpsenm].cnutrit;
    }
    else {
      uVar1 = objects[local_10->otyp].oc_nutrition;
    }
    local_14 = (uint)uVar1;
    local_10->oeaten = local_14;
  }
  if (local_10->where == '\x03') {
    freeinv(local_10);
    iVar3 = inv_cnt();
    if (iVar3 < 0x34) {
      local_10->oxlth = local_10->oxlth + 1;
      local_10 = addinv(local_10);
      local_10->oxlth = local_10->oxlth + -1;
    }
    else {
      sellobj_state(2);
      dropy(local_10);
      sellobj_state(0);
    }
  }
  return local_10;
}

Assistant:

static struct obj *touchfood(struct obj *otmp)
{
	if (otmp->quan > 1L) {
	    if (!carried(otmp))
		splitobj(otmp, otmp->quan - 1L);
	    else
		otmp = splitobj(otmp, 1L);
	}

	if (!otmp->oeaten) {
	    if (((!carried(otmp) && costly_spot(otmp->ox, otmp->oy) &&
		 !otmp->no_charge)
		 || otmp->unpaid)) {
		/* create a dummy duplicate to put on bill */
		verbalize("You bit it, you bought it!");
		bill_dummy_object(otmp);
	    }
	    otmp->oeaten = (otmp->otyp == CORPSE ?
				mons[otmp->corpsenm].cnutrit :
				objects[otmp->otyp].oc_nutrition);
	}

	if (carried(otmp)) {
	    freeinv(otmp);
	    if (inv_cnt() >= 52) {
		sellobj_state(SELL_DONTSELL);
		dropy(otmp);
		sellobj_state(SELL_NORMAL);
	    } else {
		otmp->oxlth++;		/* hack to prevent merge */
		otmp = addinv(otmp);
		otmp->oxlth--;
	    }
	}
	return otmp;
}